

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

int google::protobuf::compiler::cpp::anon_unknown_0::EstimateAlignmentSize(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  if (field == (FieldDescriptor *)0x0) {
    return 0;
  }
  local_18 = field;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    return 8;
  }
  CVar2 = FieldDescriptor::cpp_type(local_18);
  if (CVar2 != CPPTYPE_INT32) {
    if (CVar2 == CPPTYPE_INT64) {
      return 8;
    }
    if (CVar2 != CPPTYPE_UINT32) {
      if (CVar2 - CPPTYPE_UINT64 < 2) {
        return 8;
      }
      if (CVar2 != CPPTYPE_FLOAT) {
        if (CVar2 == CPPTYPE_BOOL) {
          return 1;
        }
        if (CVar2 != CPPTYPE_ENUM) {
          if (CVar2 - CPPTYPE_STRING < 2) {
            return 8;
          }
          internal::LogMessage::LogMessage
                    (&local_50,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x86);
          other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
          internal::LogFinisher::operator=(local_5d,other);
          internal::LogMessage::~LogMessage(&local_50);
          return -1;
        }
      }
    }
  }
  return 4;
}

Assistant:

int EstimateAlignmentSize(const FieldDescriptor* field) {
  if (field == NULL) return 0;
  if (field->is_repeated()) return 8;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;
  }
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}